

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

Var Js::JavascriptOperators::CallGetter
              (RecyclableObject *function,Var object,ScriptContext *requestContext)

{
  bool bVar1;
  ImplicitCallFlags IVar2;
  ThreadContext *this;
  bool bVar3;
  Attributes attributes;
  RecyclableObject *ptr;
  anon_class_40_5_fb1af45c local_50;
  
  local_50.scriptContext =
       (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  if ((local_50.scriptContext)->TTDShouldSuppressGetterInvocationForDebuggerEvaluation == true) {
    return (((requestContext->super_ScriptContextBase).javascriptLibrary)->
           super_JavascriptLibraryBase).undefinedValue.ptr;
  }
  this = (local_50.scriptContext)->threadContext;
  bVar1 = this->reentrancySafeOrHandled;
  this->reentrancySafeOrHandled = true;
  local_50.object = object;
  local_50.threadContext = this;
  local_50.function = function;
  local_50.requestContext = requestContext;
  attributes = FunctionInfo::GetAttributes(function);
  bVar3 = ThreadContext::HasNoSideEffect(this,function,attributes);
  if (bVar3) {
    ptr = (RecyclableObject *)CallGetter::anon_class_40_5_fb1af45c::operator()(&local_50);
    bVar3 = ThreadContext::IsOnStack(ptr);
  }
  else {
    if ((this->disableImplicitFlags & DisableImplicitCallFlag) != DisableImplicitNoFlag) {
      this->implicitCallFlags = this->implicitCallFlags | ImplicitCall_Accessor;
      ptr = (((((((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                scriptContext.ptr)->super_ScriptContextBase).javascriptLibrary)->
            super_JavascriptLibraryBase).undefinedValue.ptr;
      goto LAB_009a91a1;
    }
    if ((attributes & HasNoSideEffect) == None) {
      IVar2 = this->implicitCallFlags;
      ptr = (RecyclableObject *)CallGetter::anon_class_40_5_fb1af45c::operator()(&local_50);
      this->implicitCallFlags = IVar2 | ImplicitCall_Accessor;
      goto LAB_009a91a1;
    }
    ptr = (RecyclableObject *)CallGetter::anon_class_40_5_fb1af45c::operator()(&local_50);
    bVar3 = ThreadContext::IsOnStack(ptr);
  }
  if (bVar3 != false) {
    this->implicitCallFlags = this->implicitCallFlags | ImplicitCall_Accessor;
  }
LAB_009a91a1:
  this->reentrancySafeOrHandled = bVar1;
  return ptr;
}

Assistant:

Var JavascriptOperators::CallGetter(RecyclableObject * const function, Var const object, ScriptContext * requestContext)
    {
#if ENABLE_TTD
        if(function->GetScriptContext()->ShouldSuppressGetterInvocationForDebuggerEvaluation())
        {
            return requestContext->GetLibrary()->GetUndefined();
        }
#endif

        ScriptContext * scriptContext = function->GetScriptContext();
        ThreadContext * threadContext = scriptContext->GetThreadContext();
        return threadContext->ExecuteImplicitCall(function, ImplicitCall_Accessor, [=]() -> Js::Var
        {
            // Stack object should have a pre-op bail on implicit call.  We shouldn't see them here.
            // Stack numbers are ok, as we will call ToObject to wrap it in a number object anyway
            // See JavascriptOperators::GetThisHelper
            Assert(JavascriptOperators::GetTypeId(object) == TypeIds_Integer ||
                JavascriptOperators::GetTypeId(object) == TypeIds_Number ||
                threadContext->HasNoSideEffect(function) ||
                !ThreadContext::IsOnStack(object));

            // Verify that the scriptcontext is alive before firing getter/setter
            if (!scriptContext->VerifyAlive(!function->IsExternal(), requestContext))
            {
                return nullptr;
            }
            CallFlags flags = CallFlags_Value;

            Var thisVar = RootToThisObject(object, scriptContext);

            RecyclableObject* marshalledFunction = UnsafeVarTo<RecyclableObject>(
              CrossSite::MarshalVar(requestContext, function, scriptContext));

            Var result = CALL_ENTRYPOINT(threadContext, marshalledFunction->GetEntryPoint(), function, CallInfo(flags, 1), thisVar);
            result = CrossSite::MarshalVar(requestContext, result);

            // Set implicit call flags so we bail out if we're trying to propagate the value forward, e.g., from a compare. Subsequent calls
            // to the getter may produce different results.
            threadContext->AddImplicitCallFlags(ImplicitCall_Accessor);

            return result;
        });
    }